

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

int nn_bind(int s,char *addr)

{
  int iVar1;
  nn_sock *in_RAX;
  int *piVar2;
  nn_sock *sock;
  
  sock = in_RAX;
  iVar1 = nn_global_hold_socket(&sock,s);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
  }
  else {
    iVar1 = nn_global_create_ep(sock,addr,1);
    if (-1 < iVar1) {
      nn_mutex_lock(&self.lock);
      nn_sock_rele(sock);
      nn_mutex_unlock(&self.lock);
      return iVar1;
    }
    nn_global_rele_socket(sock);
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
  }
  return -1;
}

Assistant:

int nn_bind (int s, const char *addr)
{
    int rc;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (rc < 0) {
        errno = -rc;
        return -1;
    }

    rc = nn_global_create_ep (sock, addr, 1);
    if (nn_slow (rc < 0)) {
        nn_global_rele_socket (sock);
        errno = -rc;
        return -1;
    }

    nn_global_rele_socket (sock);
    return rc;
}